

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  uchar buf [64];
  
  iVar4 = -0x3c;
  if (len < 0x41) {
    iVar4 = 0;
    do {
      if (iVar4 == 0x101) {
        return -0x3c;
      }
      iVar1 = entropy_gather_internal((mbedtls_entropy_context *)data);
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar4 = iVar4 + 1;
      uVar2 = (ulong)*(uint *)((long)data + 0xd8);
      if ((int)*(uint *)((long)data + 0xd8) < 1) {
        uVar2 = 0;
      }
      uVar5 = 1;
      for (lVar3 = 0; uVar2 * 0x28 - lVar3 != 0; lVar3 = lVar3 + 0x28) {
        if (*(ulong *)((long)data + lVar3 + 0xf0) < *(ulong *)((long)data + lVar3 + 0xf8)) {
          uVar5 = 0;
        }
      }
    } while ((int)uVar5 == 0);
    buf[0x30] = '\0';
    buf[0x31] = '\0';
    buf[0x32] = '\0';
    buf[0x33] = '\0';
    buf[0x34] = '\0';
    buf[0x35] = '\0';
    buf[0x36] = '\0';
    buf[0x37] = '\0';
    buf[0x38] = '\0';
    buf[0x39] = '\0';
    buf[0x3a] = '\0';
    buf[0x3b] = '\0';
    buf[0x3c] = '\0';
    buf[0x3d] = '\0';
    buf[0x3e] = '\0';
    buf[0x3f] = '\0';
    buf[0x20] = '\0';
    buf[0x21] = '\0';
    buf[0x22] = '\0';
    buf[0x23] = '\0';
    buf[0x24] = '\0';
    buf[0x25] = '\0';
    buf[0x26] = '\0';
    buf[0x27] = '\0';
    buf[0x28] = '\0';
    buf[0x29] = '\0';
    buf[0x2a] = '\0';
    buf[0x2b] = '\0';
    buf[0x2c] = '\0';
    buf[0x2d] = '\0';
    buf[0x2e] = '\0';
    buf[0x2f] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    buf[0x18] = '\0';
    buf[0x19] = '\0';
    buf[0x1a] = '\0';
    buf[0x1b] = '\0';
    buf[0x1c] = '\0';
    buf[0x1d] = '\0';
    buf[0x1e] = '\0';
    buf[0x1f] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    mbedtls_sha512_finish((mbedtls_sha512_context *)data,buf);
    uVar5 = 0;
    memset(data,0,0xd8);
    mbedtls_sha512_starts((mbedtls_sha512_context *)data,0);
    mbedtls_sha512_update((mbedtls_sha512_context *)data,buf,0x40);
    mbedtls_sha512(buf,0x40,buf,0);
    uVar2 = (ulong)*(uint *)((long)data + 0xd8);
    if ((int)*(uint *)((long)data + 0xd8) < 1) {
      uVar2 = uVar5;
    }
    for (; uVar2 * 0x28 - uVar5 != 0; uVar5 = uVar5 + 0x28) {
      *(undefined8 *)((long)data + uVar5 + 0xf0) = 0;
    }
    memcpy(output,buf,len);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int mbedtls_entropy_func( void *data, unsigned char *output, size_t len )
{
    int ret, count = 0, i, done;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if( len > MBEDTLS_ENTROPY_BLOCK_SIZE )
        return( MBEDTLS_ERR_ENTROPY_SOURCE_FAILED );

#if defined(MBEDTLS_ENTROPY_NV_SEED)
    /* Update the NV entropy seed before generating any entropy for outside
     * use.
     */
    if( ctx->initial_entropy_run == 0 )
    {
        ctx->initial_entropy_run = 1;
        if( ( ret = mbedtls_entropy_update_nv_seed( ctx ) ) != 0 )
            return( ret );
    }
#endif

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    /*
     * Always gather extra entropy before a call
     */
    do
    {
        if( count++ > ENTROPY_MAX_LOOP )
        {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if( ( ret = entropy_gather_internal( ctx ) ) != 0 )
            goto exit;

        done = 1;
        for( i = 0; i < ctx->source_count; i++ )
            if( ctx->source[i].size < ctx->source[i].threshold )
                done = 0;
    }
    while( ! done );

    memset( buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE );

#if defined(MBEDTLS_ENTROPY_SHA512_ACCUMULATOR)
    mbedtls_sha512_finish( &ctx->accumulator, buf );

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    memset( &ctx->accumulator, 0, sizeof( mbedtls_sha512_context ) );
    mbedtls_sha512_starts( &ctx->accumulator, 0 );
    mbedtls_sha512_update( &ctx->accumulator, buf, MBEDTLS_ENTROPY_BLOCK_SIZE );

    /*
     * Perform second SHA-512 on entropy
     */
    mbedtls_sha512( buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf, 0 );
#else /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */
    mbedtls_sha256_finish( &ctx->accumulator, buf );

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    memset( &ctx->accumulator, 0, sizeof( mbedtls_sha256_context ) );
    mbedtls_sha256_starts( &ctx->accumulator, 0 );
    mbedtls_sha256_update( &ctx->accumulator, buf, MBEDTLS_ENTROPY_BLOCK_SIZE );

    /*
     * Perform second SHA-256 on entropy
     */
    mbedtls_sha256( buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf, 0 );
#endif /* MBEDTLS_ENTROPY_SHA512_ACCUMULATOR */

    for( i = 0; i < ctx->source_count; i++ )
        ctx->source[i].size = 0;

    memcpy( output, buf, len );

    ret = 0;

exit:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}